

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::nextValue(Lexer *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  _Ios_Openmode _Var5;
  Token *in_RSI;
  Token *in_RDI;
  bool bVar6;
  double d;
  stringstream ss_1;
  int64_t x;
  stringstream ss;
  char c;
  string s;
  undefined4 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdc;
  undefined1 in_stack_fffffffffffffbdd;
  undefined1 in_stack_fffffffffffffbde;
  undefined1 in_stack_fffffffffffffbdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbec;
  undefined1 in_stack_fffffffffffffbed;
  undefined1 in_stack_fffffffffffffbee;
  undefined1 in_stack_fffffffffffffbef;
  Token *pTVar7;
  undefined7 in_stack_fffffffffffffc08;
  double local_3f0;
  string *in_stack_fffffffffffffc18;
  stringstream local_3c8 [32];
  string *in_stack_fffffffffffffc58;
  long local_240;
  string local_238 [32];
  stringstream local_218 [136];
  string *in_stack_fffffffffffffe70;
  Lexer *in_stack_fffffffffffffe78;
  undefined1 local_89 [33];
  string local_68 [32];
  undefined4 local_48;
  char local_31;
  string local_30 [48];
  
  pTVar7 = in_RDI;
  std::__cxx11::string::string(local_30);
  uVar1 = current((Lexer *)CONCAT17(in_stack_fffffffffffffbef,
                                    CONCAT16(in_stack_fffffffffffffbee,
                                             CONCAT15(in_stack_fffffffffffffbed,
                                                      CONCAT14(in_stack_fffffffffffffbec,
                                                               in_stack_fffffffffffffbe8)))),
                  (char *)in_stack_fffffffffffffbe0);
  if (((bool)uVar1) && (iVar4 = isalpha((int)local_31), iVar4 != 0)) {
    std::__cxx11::string::operator+=(local_30,local_31);
    next((Lexer *)in_stack_fffffffffffffbe0);
    while( true ) {
      in_stack_fffffffffffffbef =
           current((Lexer *)CONCAT17(in_stack_fffffffffffffbef,
                                     CONCAT16(in_stack_fffffffffffffbee,
                                              CONCAT15(in_stack_fffffffffffffbed,
                                                       CONCAT14(in_stack_fffffffffffffbec,
                                                                in_stack_fffffffffffffbe8)))),
                   (char *)in_stack_fffffffffffffbe0);
      in_stack_fffffffffffffbee = false;
      if ((bool)in_stack_fffffffffffffbef) {
        iVar4 = isalpha((int)local_31);
        in_stack_fffffffffffffbee = iVar4 != 0;
      }
      if ((bool)in_stack_fffffffffffffbee == false) break;
      std::__cxx11::string::operator+=(local_30,local_31);
      next((Lexer *)in_stack_fffffffffffffbe0);
    }
    uVar1 = std::operator==(in_stack_fffffffffffffbe0,
                            (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                             CONCAT16(in_stack_fffffffffffffbde,
                                                      CONCAT15(in_stack_fffffffffffffbdd,
                                                               CONCAT14(in_stack_fffffffffffffbdc,
                                                                        in_stack_fffffffffffffbd8)))
                                            ));
    if ((bool)uVar1) {
      Token::Token(in_RSI,(TokenType)((ulong)pTVar7 >> 0x20),SUB81((ulong)pTVar7 >> 0x18,0));
      local_48 = 1;
    }
    else {
      uVar2 = std::operator==(in_stack_fffffffffffffbe0,
                              (char *)CONCAT17(in_stack_fffffffffffffbdf,
                                               CONCAT16(in_stack_fffffffffffffbde,
                                                        CONCAT15(in_stack_fffffffffffffbdd,
                                                                 CONCAT14(in_stack_fffffffffffffbdc,
                                                                          in_stack_fffffffffffffbd8)
                                                                ))));
      if ((bool)uVar2) {
        Token::Token(in_RSI,(TokenType)((ulong)pTVar7 >> 0x20),SUB81((ulong)pTVar7 >> 0x18,0));
        local_48 = 1;
      }
      else {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_89 + 1),"Unknown ident: ",(allocator *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffbef,
                                CONCAT16(in_stack_fffffffffffffbee,
                                         CONCAT15(uVar1,CONCAT14(uVar2,in_stack_fffffffffffffbe8))))
                       ,__rhs);
        Token::Token(in_RSI,(TokenType)((ulong)pTVar7 >> 0x20),(string *)in_RDI);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string((string *)(local_89 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_89);
        local_48 = 1;
      }
    }
  }
  else {
    while( true ) {
      bVar3 = current((Lexer *)CONCAT17(in_stack_fffffffffffffbef,
                                        CONCAT16(in_stack_fffffffffffffbee,
                                                 CONCAT15(in_stack_fffffffffffffbed,
                                                          CONCAT14(in_stack_fffffffffffffbec,
                                                                   in_stack_fffffffffffffbe8)))),
                      (char *)in_stack_fffffffffffffbe0);
      bVar6 = false;
      if (((bVar3) &&
          ((((local_31 < '0' || (bVar6 = true, '9' < local_31)) && (bVar6 = true, local_31 != '.'))
           && ((bVar6 = true, local_31 != 'e' && (bVar6 = true, local_31 != 'E')))))) &&
         ((bVar6 = true, local_31 != 'T' &&
          (((bVar6 = true, local_31 != 'Z' && (bVar6 = true, local_31 != '_')) &&
           ((bVar6 = true, local_31 != ':' && (bVar6 = true, local_31 != '-')))))))) {
        bVar6 = local_31 == '+';
      }
      if (!bVar6) break;
      next((Lexer *)in_stack_fffffffffffffbe0);
      std::__cxx11::string::operator+=(local_30,local_31);
    }
    bVar3 = isInteger((string *)CONCAT17(uVar1,in_stack_fffffffffffffc08));
    if (bVar3) {
      removeDelimiter(in_stack_fffffffffffffc18);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_218,local_238,_Var5);
      std::__cxx11::string::~string(local_238);
      std::istream::operator>>(local_218,&local_240);
      Token::Token(in_RSI,(TokenType)((ulong)pTVar7 >> 0x20),(int64_t)in_RDI);
      local_48 = 1;
      std::__cxx11::stringstream::~stringstream(local_218);
    }
    else {
      bVar3 = isDouble(in_stack_fffffffffffffc58);
      if (bVar3) {
        removeDelimiter(in_stack_fffffffffffffc18);
        _Var5 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_3c8,(string *)&stack0xfffffffffffffc18,_Var5)
        ;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
        std::istream::operator>>(local_3c8,&local_3f0);
        Token::Token(in_RSI,(TokenType)((ulong)pTVar7 >> 0x20),(double)in_RDI);
        local_48 = 1;
        std::__cxx11::stringstream::~stringstream(local_3c8);
      }
      else {
        parseAsTime(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
        local_48 = 1;
      }
    }
  }
  std::__cxx11::string::~string(local_30);
  return pTVar7;
}

Assistant:

inline Token Lexer::nextValue()
{
    std::string s;
    char c;

    if (current(&c) && isalpha(c)) {
        s += c;
        next();
        while (current(&c) && isalpha(c)) {
            s += c;
            next();
        }

        if (s == "true")
            return Token(TokenType::BOOL, true);
        if (s == "false")
            return Token(TokenType::BOOL, false);
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown ident: ") + s);
    }

    while (current(&c) && (('0' <= c && c <= '9') || c == '.' || c == 'e' || c == 'E' ||
                           c == 'T' || c == 'Z' || c == '_' || c == ':' || c == '-' || c == '+')) {
        next();
        s += c;
    }

    if (isInteger(s)) {
        std::stringstream ss(removeDelimiter(s));
        std::int64_t x;
        ss >> x;
        return Token(TokenType::INT, x);
    }

    if (isDouble(s)) {
        std::stringstream ss(removeDelimiter(s));
        double d;
        ss >> d;
        return Token(TokenType::DOUBLE, d);
    }

    return parseAsTime(s);
}